

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderAtomicOpCase::init(ShaderAtomicOpCase *this,EVP_PKEY_CTX *ctx)

{
  AtomicOperandType AVar1;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *__s;
  char *pcVar5;
  ostream *poVar6;
  ShaderProgram *pSVar7;
  ProgramSources *sources;
  TestError *this_00;
  Hex<8UL> hex;
  DataType dataType;
  bool *pbVar8;
  undefined1 local_2c0 [40];
  string local_298;
  string castBeg;
  ostringstream src;
  
  AVar1 = this->m_operandType;
  pcVar3 = glu::getPrecisionName(this->m_precision);
  pcVar4 = glu::getDataTypeName(this->m_type);
  if (AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    dataType = this->m_type;
  }
  else {
    dataType = TYPE_UINT;
  }
  __s = glu::getDataTypeName(dataType);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar5 = glu::getGLSLVersionDeclaration(version);
  poVar6 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout(local_size_x = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", local_size_y = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,", local_size_z = ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,") in;\n");
  poVar6 = std::operator<<(poVar6,"layout(binding = 0) buffer InOut\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,pcVar3);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,pcVar4);
  poVar6 = std::operator<<(poVar6," inputValues[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n");
  poVar6 = std::operator<<(poVar6,"\t");
  poVar6 = std::operator<<(poVar6,pcVar3);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,__s);
  poVar6 = std::operator<<(poVar6," outputValues[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n");
  poVar6 = std::operator<<(poVar6,"\t");
  pcVar5 = "coherent ";
  if (AVar1 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    pcVar5 = glcts::fixed_sample_locations_values + 1;
  }
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6,pcVar3);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,__s);
  poVar6 = std::operator<<(poVar6," groupValues[");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,"];\n");
  std::operator<<(poVar6,"} sb_inout;\n");
  if (AVar1 != ATOMIC_OPERAND_BUFFER_VARIABLE) {
    poVar6 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"shared ");
    poVar6 = std::operator<<(poVar6,pcVar3);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,pcVar4);
    std::operator<<(poVar6," s_var;\n");
  }
  poVar6 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  poVar6 = std::operator<<(poVar6,"void main (void)\n");
  poVar6 = std::operator<<(poVar6,"{\n");
  poVar6 = std::operator<<(poVar6,
                           "\tuint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar6 = std::operator<<(poVar6,
                           "\tuint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar6 = std::operator<<(poVar6,"\tuint globalOffs = localSize*globalNdx;\n");
  poVar6 = std::operator<<(poVar6,"\tuint offset     = globalOffs + gl_LocalInvocationIndex;\n");
  std::operator<<(poVar6,"\n");
  if (AVar1 == ATOMIC_OPERAND_BUFFER_VARIABLE) {
    poVar6 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tsb_inout.outputValues[offset] = ");
    poVar6 = std::operator<<(poVar6,(string *)&this->m_funcName);
    std::operator<<(poVar6,"(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n");
  }
  else {
    if (this->m_type == TYPE_UINT) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&castBeg,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)local_2c0);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2c0,__s,(allocator<char> *)&local_298);
      std::operator+(&castBeg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2c0,"(");
      std::__cxx11::string::~string((string *)local_2c0);
    }
    pbVar8 = (bool *)0x17263e7;
    if (this->m_type == TYPE_UINT) {
      pbVar8 = glcts::fixed_sample_locations_values + 1;
    }
    poVar6 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tif (gl_LocalInvocationIndex == 0u)\n");
    poVar6 = std::operator<<(poVar6,"\t\ts_var = ");
    poVar6 = std::operator<<(poVar6,pcVar4);
    poVar6 = std::operator<<(poVar6,"(");
    hex.value._4_4_ = 0;
    hex.value._0_4_ = this->m_initialValue;
    poVar6 = tcu::Format::operator<<(poVar6,hex);
    poVar6 = std::operator<<(poVar6,"u);\n");
    poVar6 = std::operator<<(poVar6,"\tbarrier();\n");
    poVar6 = std::operator<<(poVar6,"\t");
    poVar6 = std::operator<<(poVar6,pcVar3);
    poVar6 = std::operator<<(poVar6," ");
    poVar6 = std::operator<<(poVar6,pcVar4);
    poVar6 = std::operator<<(poVar6," res = ");
    poVar6 = std::operator<<(poVar6,(string *)&this->m_funcName);
    poVar6 = std::operator<<(poVar6,"(s_var, sb_inout.inputValues[offset]);\n");
    poVar6 = std::operator<<(poVar6,"\tsb_inout.outputValues[offset] = ");
    poVar6 = std::operator<<(poVar6,(string *)&castBeg);
    poVar6 = std::operator<<(poVar6,"res");
    poVar6 = std::operator<<(poVar6,pbVar8);
    poVar6 = std::operator<<(poVar6,";\n");
    poVar6 = std::operator<<(poVar6,"\tbarrier();\n");
    poVar6 = std::operator<<(poVar6,"\tif (gl_LocalInvocationIndex == 0u)\n");
    poVar6 = std::operator<<(poVar6,"\t\tsb_inout.groupValues[globalNdx] = ");
    poVar6 = std::operator<<(poVar6,(string *)&castBeg);
    poVar6 = std::operator<<(poVar6,"s_var");
    poVar6 = std::operator<<(poVar6,pbVar8);
    std::operator<<(poVar6,";\n");
    std::__cxx11::string::~string((string *)&castBeg);
  }
  std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  pSVar7 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&castBeg,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)local_2c0,&local_298);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&castBeg,(ShaderSource *)local_2c0);
  glu::ShaderProgram::ShaderProgram(pSVar7,renderCtx,sources);
  this->m_program = pSVar7;
  std::__cxx11::string::~string((string *)(local_2c0 + 8));
  std::__cxx11::string::~string((string *)&local_298);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&castBeg);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  pSVar7 = this->m_program;
  if ((pSVar7->m_program).m_info.linkOk != false) {
    iVar2 = std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
    return iVar2;
  }
  glu::ShaderProgram::~ShaderProgram(pSVar7);
  operator_delete(pSVar7,0xd0);
  this->m_program = (ShaderProgram *)0x0;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&castBeg,"Compile failed",(allocator<char> *)local_2c0);
  tcu::TestError::TestError(this_00,&castBeg);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderAtomicOpCase::init (void)
{
	const bool			isSSBO		= m_operandType == ATOMIC_OPERAND_BUFFER_VARIABLE;
	const char*			precName	= getPrecisionName(m_precision);
	const char*			typeName	= getDataTypeName(m_type);

	const DataType		outType		= isSSBO ? m_type : glu::TYPE_UINT;
	const char*			outTypeName	= getDataTypeName(outType);

	const deUint32		numValues	= product(m_workGroupSize)*product(m_numWorkGroups);
	std::ostringstream	src;

	src << glu::getGLSLVersionDeclaration(getContextTypeGLSLVersion(m_context.getRenderContext().getType())) << "\n"
		<< "layout(local_size_x = " << m_workGroupSize.x()
		<< ", local_size_y = " << m_workGroupSize.y()
		<< ", local_size_z = " << m_workGroupSize.z() << ") in;\n"
		<< "layout(binding = 0) buffer InOut\n"
		<< "{\n"
		<< "	" << precName << " " << typeName << " inputValues[" << numValues << "];\n"
		<< "	" << precName << " " << outTypeName << " outputValues[" << numValues << "];\n"
		<< "	" << (isSSBO ? "coherent " : "") << precName << " " << outTypeName << " groupValues[" << product(m_numWorkGroups) << "];\n"
		<< "} sb_inout;\n";

	if (!isSSBO)
		src << "shared " << precName << " " << typeName << " s_var;\n";

	src << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "	uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "	uint globalOffs = localSize*globalNdx;\n"
		<< "	uint offset     = globalOffs + gl_LocalInvocationIndex;\n"
		<< "\n";

	if (isSSBO)
	{
		DE_ASSERT(outType == m_type);
		src << "	sb_inout.outputValues[offset] = " << m_funcName << "(sb_inout.groupValues[globalNdx], sb_inout.inputValues[offset]);\n";
	}
	else
	{
		const string		castBeg	= outType != m_type ? (string(outTypeName) + "(") : string("");
		const char* const	castEnd	= outType != m_type ? ")" : "";

		src << "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		s_var = " << typeName << "(" << tcu::toHex(m_initialValue) << "u);\n"
			<< "	barrier();\n"
			<< "	" << precName << " " << typeName << " res = " << m_funcName << "(s_var, sb_inout.inputValues[offset]);\n"
			<< "	sb_inout.outputValues[offset] = " << castBeg << "res" << castEnd << ";\n"
			<< "	barrier();\n"
			<< "	if (gl_LocalInvocationIndex == 0u)\n"
			<< "		sb_inout.groupValues[globalNdx] = " << castBeg << "s_var" << castEnd << ";\n";
	}

	src << "}\n";

	DE_ASSERT(!m_program);
	m_program = new ShaderProgram(m_context.getRenderContext(), ProgramSources() << ComputeSource(src.str()));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		delete m_program;
		m_program = DE_NULL;
		throw tcu::TestError("Compile failed");
	}
}